

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O0

void __thiscall
InstructionVMEvalContext::StackFrame::AssignRegister(StackFrame *this,uint id,VmConstant *constant)

{
  uint index;
  uint uVar1;
  VmConstant **ppVVar2;
  uint newSize;
  uint oldSize;
  VmConstant *constant_local;
  uint id_local;
  StackFrame *this_local;
  
  if (id != 0) {
    index = SmallArray<VmConstant_*,_32U>::size(&this->instructionValues);
    if (index < id) {
      SmallArray<VmConstant_*,_32U>::resize(&this->instructionValues,id + 0x20);
      ppVVar2 = SmallArray<VmConstant_*,_32U>::operator[](&this->instructionValues,index);
      uVar1 = SmallArray<VmConstant_*,_32U>::size(&this->instructionValues);
      memset(ppVVar2,0,(ulong)(uVar1 - index) << 3);
    }
    ppVVar2 = SmallArray<VmConstant_*,_32U>::operator[](&this->instructionValues,id - 1);
    *ppVVar2 = constant;
    return;
  }
  __assert_fail("id != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                ,0x80,
                "void InstructionVMEvalContext::StackFrame::AssignRegister(unsigned int, VmConstant *)"
               );
}

Assistant:

void InstructionVMEvalContext::StackFrame::AssignRegister(unsigned id, VmConstant *constant)
{
	assert(id != 0);

	unsigned oldSize = instructionValues.size();
	unsigned newSize = id;

	if(newSize > oldSize)
	{
		instructionValues.resize(newSize + 32);

		memset(&instructionValues[oldSize], 0, (instructionValues.size() - oldSize) * sizeof(instructionValues[0]));
	}

	instructionValues[id - 1] = constant;
}